

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

bool deqp::gls::TextureStateQueryTests::anon_unknown_1::es32::isCoreQuery(QueryType query)

{
  bool bVar1;
  undefined1 local_d;
  QueryType query_local;
  
  bVar1 = es31::isCoreQuery(query);
  local_d = true;
  if ((((((!bVar1) && (local_d = true, query != QUERY_TEXTURE_PARAM_PURE_INTEGER)) &&
        (local_d = true, query != QUERY_TEXTURE_PARAM_PURE_INTEGER)) &&
       ((local_d = true, query != QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER &&
        (local_d = true, query != QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4)))) &&
      ((local_d = true, query != QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4 &&
       ((local_d = true, query != QUERY_SAMPLER_PARAM_PURE_INTEGER &&
        (local_d = true, query != QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER)))))) &&
     (local_d = true, query != QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4)) {
    local_d = query == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4;
  }
  return local_d;
}

Assistant:

static bool isCoreQuery (QueryType query)
{
	return	es31::isCoreQuery(query)								||
			query == QUERY_TEXTURE_PARAM_PURE_INTEGER				||
			query == QUERY_TEXTURE_PARAM_PURE_INTEGER				||
			query == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER		||
			query == QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4			||
			query == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4	||
			query == QUERY_SAMPLER_PARAM_PURE_INTEGER				||
			query == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER		||
			query == QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4			||
			query == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4;
}